

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_js_api_json_autogen.cpp
# Opt level: O3

PsbtBip32PubkeyInputStruct * __thiscall
cfd::js::api::json::PsbtBip32PubkeyInput::ConvertToStruct
          (PsbtBip32PubkeyInputStruct *__return_storage_ptr__,PsbtBip32PubkeyInput *this)

{
  PsbtBip32PubkeyInputStruct::PsbtBip32PubkeyInputStruct(__return_storage_ptr__);
  std::__cxx11::string::_M_assign((string *)__return_storage_ptr__);
  std::__cxx11::string::_M_assign((string *)&__return_storage_ptr__->pubkey);
  std::__cxx11::string::_M_assign((string *)&__return_storage_ptr__->master_fingerprint);
  std::__cxx11::string::_M_assign((string *)&__return_storage_ptr__->path);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=(&(__return_storage_ptr__->ignore_items)._M_t,&(this->ignore_items)._M_t);
  return __return_storage_ptr__;
}

Assistant:

PsbtBip32PubkeyInputStruct PsbtBip32PubkeyInput::ConvertToStruct() const {  // NOLINT
  PsbtBip32PubkeyInputStruct result;
  result.descriptor = descriptor_;
  result.pubkey = pubkey_;
  result.master_fingerprint = master_fingerprint_;
  result.path = path_;
  result.ignore_items = ignore_items;
  return result;
}